

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O0

void IpmiFruBuildProductInfoArea(EeePSystemInfo_t *info)

{
  EeePSystemInfo_t *base;
  char *pcVar1;
  uint8_t *puVar2;
  uint8_t *product_area_ptr;
  char *str;
  void *strstart;
  uint8_t *varp;
  EeePSystemInfo_t *info_local;
  
  product_info_area.area.format_version = '\x01';
  product_info_area.area.language_code = '\x19';
  base = info + 1;
  pcVar1 = GetSmbiosString(info->Manufacturer,base);
  if (pcVar1 == (char *)0x0) {
    strstart = product_info_area.pad;
    product_info_area.area.variable_part[0] = 0xc0;
  }
  else {
    strstart = IpmiFruAddString(product_info_area.area.variable_part,pcVar1);
  }
  pcVar1 = GetSmbiosString(info->ProductName,base);
  if (pcVar1 == (char *)0x0) {
    *(undefined1 *)strstart = 0xc0;
    strstart = (void *)((long)strstart + 1);
  }
  else {
    strstart = IpmiFruAddString((uint8_t *)strstart,pcVar1);
  }
  puVar2 = (uint8_t *)((long)strstart + 1);
  *(undefined1 *)strstart = 0xc0;
  pcVar1 = GetSmbiosString(info->Version,base);
  if (pcVar1 == (char *)0x0) {
    strstart = (void *)((long)strstart + 2);
    *puVar2 = 0xc0;
  }
  else {
    strstart = IpmiFruAddString(puVar2,pcVar1);
  }
  pcVar1 = GetSmbiosString(info->SerialNumber,base);
  if (pcVar1 == (char *)0x0) {
    *(undefined1 *)strstart = 0xc0;
    strstart = (void *)((long)strstart + 1);
  }
  else {
    strstart = IpmiFruAddString((uint8_t *)strstart,pcVar1);
  }
  pcVar1 = GetSmbiosString(info->SKU_Number,base);
  if (pcVar1 == (char *)0x0) {
    *(undefined1 *)strstart = 0xc0;
    strstart = (void *)((long)strstart + 1);
  }
  else {
    strstart = IpmiFruAddString((uint8_t *)strstart,pcVar1);
  }
  puVar2 = (uint8_t *)((long)strstart + 1);
  *(undefined1 *)strstart = 0xc0;
  pcVar1 = GetSmbiosString(info->Family,base);
  strstart = puVar2;
  if (pcVar1 != (char *)0x0) {
    strstart = IpmiFruAddCustomString(puVar2,"FAMILY",pcVar1);
  }
  product_info_area_size =
       IpmiFruFinalizeArea((uint8_t *)&product_info_area,(int)strstart - 0x106170);
  return;
}

Assistant:

void IpmiFruBuildProductInfoArea(EeePSystemInfo_t *info)
{
    product_info_area.area.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    product_info_area.area.language_code = IPMI_FRUINFO_LANGUAGE_CODE_ENGLISH;
    uint8_t *varp = product_info_area.area.variable_part;

    void *strstart = info + 1;
    const char *str;
    //  Manufacturer
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Product name
    if (str = GetSmbiosString(info->ProductName, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Model/Part number - not specified
    *varp++ = 0xC0;
    //  Version
    if (str = GetSmbiosString(info->Version, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Serial number
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Asset tag - use SKU number
    if (str = GetSmbiosString(info->SKU_Number, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  FRU File ID - not specified
    *varp++ = 0xC0;
    //  Family as custom string
    if (str = GetSmbiosString(info->Family, strstart)) {
        varp = IpmiFruAddCustomString(varp, "FAMILY", str);
    }
    uint8_t *product_area_ptr = (uint8_t *)&product_info_area;
    product_info_area_size = IpmiFruFinalizeArea(product_area_ptr, varp-product_area_ptr);
}